

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void unixShmPurge(unixFile *pFd)

{
  int iVar1;
  int h;
  long in_RDI;
  int i;
  int nShmPerMap;
  unixShmNode *p;
  int lineno;
  unixFile *pFile;
  
  pFile = *(unixFile **)(*(long *)(in_RDI + 0x10) + 0x38);
  if ((pFile != (unixFile *)0x0) && (*(int *)&pFile->pPreallocatedUnused == 0)) {
    h = unixShmRegionPerMap();
    sqlite3_mutex_free((sqlite3_mutex *)0x1569d4);
    for (lineno = 0; lineno < (int)(uint)(ushort)pFile->lastErrno; lineno = h + lineno) {
      if (pFile->h < 0) {
        sqlite3_free((void *)0x156a31);
      }
      else {
        iVar1._0_1_ = pFile->eFileLock;
        iVar1._1_1_ = pFile->field_0x1d;
        iVar1._2_2_ = pFile->ctrlFlags;
        (*aSyscall[0x17].pCurrent)
                  (*(undefined8 *)((long)pFile->lockingContext + (long)lineno * 8),(long)iVar1);
      }
    }
    sqlite3_free((void *)0x156a4d);
    if (-1 < pFile->h) {
      robust_close(pFile,h,lineno);
      pFile->h = -1;
    }
    pFile->pMethod->xLock = (_func_int_sqlite3_file_ptr_int *)0x0;
    sqlite3_free((void *)0x156a95);
  }
  return;
}

Assistant:

static void unixShmPurge(unixFile *pFd){
  unixShmNode *p = pFd->pInode->pShmNode;
  assert( unixMutexHeld() );
  if( p && ALWAYS(p->nRef==0) ){
    int nShmPerMap = unixShmRegionPerMap();
    int i;
    assert( p->pInode==pFd->pInode );
    sqlite3_mutex_free(p->pShmMutex);
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
    for(i=0; i<SQLITE_SHM_NLOCK; i++){
      sqlite3_mutex_free(p->aMutex[i]);
    }
#endif
    for(i=0; i<p->nRegion; i+=nShmPerMap){
      if( p->hShm>=0 ){
        osMunmap(p->apRegion[i], p->szRegion);
      }else{
        sqlite3_free(p->apRegion[i]);
      }
    }
    sqlite3_free(p->apRegion);
    if( p->hShm>=0 ){
      robust_close(pFd, p->hShm, __LINE__);
      p->hShm = -1;
    }
    p->pInode->pShmNode = 0;
    sqlite3_free(p);
  }
}